

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O0

void set_ref_cb_base_msb(VdpuAv1dRegSet *regs,RK_S32 i,RK_S32 val)

{
  RK_S32 val_local;
  RK_S32 i_local;
  VdpuAv1dRegSet *regs_local;
  
  if (i == 0) {
    (regs->addr_cfg).swreg100 = (anon_struct_4_1_547e3e7d_for_swreg100)val;
  }
  else if (i == 1) {
    (regs->addr_cfg).swreg102 = (anon_struct_4_1_e962f13e_for_swreg102)val;
  }
  else if (i == 2) {
    (regs->addr_cfg).swreg104 = (anon_struct_4_1_7e47a3ff_for_swreg104)val;
  }
  else if (i == 3) {
    (regs->addr_cfg).swreg106 = (anon_struct_4_1_132c56c0_for_swreg106)val;
  }
  else if (i == 4) {
    (regs->addr_cfg).swreg108 = (anon_struct_4_1_a8110981_for_swreg108)val;
  }
  else if (i == 5) {
    (regs->addr_cfg).swreg110 = (anon_struct_4_1_3cf5bc42_for_swreg110)val;
  }
  else if (i == 6) {
    (regs->addr_cfg).swreg112 = (anon_struct_4_1_d1da6f03_for_swreg112)val;
  }
  else {
    _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
  }
  return;
}

Assistant:

static void set_ref_cb_base_msb(VdpuAv1dRegSet *regs, RK_S32 i, RK_S32 val)
{
    if (i == 0) {
        regs->addr_cfg.swreg100.sw_refer0_cbase_msb = val;
    } else if (i == 1) {
        regs->addr_cfg.swreg102.sw_refer1_cbase_msb = val;
    } else if (i == 2) {
        regs->addr_cfg.swreg104.sw_refer2_cbase_msb = val;
    } else if (i == 3) {
        regs->addr_cfg.swreg106.sw_refer3_cbase_msb = val;
    } else if (i == 4) {
        regs->addr_cfg.swreg108.sw_refer4_cbase_msb = val;
    } else if (i == 5) {
        regs->addr_cfg.swreg110.sw_refer5_cbase_msb = val;
    } else if (i == 6) {
        regs->addr_cfg.swreg112.sw_refer6_cbase_msb = val;
    } else {
        mpp_err("Error: trying to set invalid reference index.");
    }
}